

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

void __thiscall Dice::showResolvedHand(Dice *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  long *plVar4;
  _Base_ptr p_Var5;
  char **ppcVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Current resolved items -------",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  p_Var5 = (this->resolvedHand)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->resolvedHand)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    ppcVar6 = this->DiceNames;
    do {
      iVar2 = *(int *)&p_Var5[1].field_0x4;
      __s = *ppcVar6;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1281d0);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      ppcVar6 = ppcVar6 + 1;
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------------------------",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void Dice::showResolvedHand() {
    int index = 0;
    cout << "Current resolved items -------" << endl;
    for (auto hand : resolvedHand) {
        cout << DiceNames[index] << " : " << hand.second << endl;
        index++;
    }
    cout << "----------------------------" << endl;

}